

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_finishset(lua_State *L,TValue *t,TValue *key,TValue *val,TValue *slot)

{
  Table *t_00;
  Table *events;
  byte bVar1;
  TValue *f;
  TValue *io1;
  int iVar2;
  
  iVar2 = 2000;
  do {
    if (slot == (TValue *)0x0) {
      f = luaT_gettmbyobj(L,t,TM_NEWINDEX);
      bVar1 = f->tt_;
      if ((bVar1 & 0xf) == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      t_00 = (Table *)(t->value_).gc;
      events = t_00->metatable;
      if (((events == (Table *)0x0) || ((events->flags & 2) != 0)) ||
         (f = luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1]), f == (TValue *)0x0)) {
        luaH_finishset(L,t_00,key,slot,val);
        t_00->flags = t_00->flags & 0xc0;
        if ((val->tt_ & 0x40) == 0) {
          return;
        }
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        bVar1 = ((val->value_).gc)->marked;
        goto joined_r0x00116a4f;
      }
      bVar1 = f->tt_;
    }
    if ((bVar1 & 0xf) == 6) {
      luaT_callTM(L,f,t,key,val);
      return;
    }
    if (bVar1 == 0x45) {
      slot = luaH_get((Table *)(f->value_).gc,key);
      if ((slot->tt_ & 0xf) != 0) {
        slot->value_ = val->value_;
        bVar1 = val->tt_;
        slot->tt_ = bVar1;
        if ((bVar1 & 0x40) == 0) {
          return;
        }
        t_00 = (Table *)(f->value_).gc;
        if ((t_00->marked & 0x20) == 0) {
          return;
        }
        bVar1 = ((val->value_).gc)->marked;
joined_r0x00116a4f:
        if ((bVar1 & 0x18) == 0) {
          return;
        }
        luaC_barrierback_(L,(GCObject *)t_00);
        return;
      }
    }
    else {
      slot = (TValue *)0x0;
    }
    iVar2 = iVar2 + -1;
    t = f;
    if (iVar2 == 0) {
      luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
    }
  } while( true );
}

Assistant:

void luaV_finishset (lua_State *L, const TValue *t, TValue *key,
                     TValue *val, const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;  /* '__newindex' metamethod */
    if (slot != NULL) {  /* is 't' a table? */
      Table *h = hvalue(t);  /* save 't' table */
      lua_assert(isempty(slot));  /* slot must be empty */
      tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
      if (tm == NULL) {  /* no metamethod? */
        luaH_finishset(L, h, key, slot, val);  /* set new value */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else {  /* not a table; check metamethod */
      tm = luaT_gettmbyobj(L, t, TM_NEWINDEX);
      if (l_unlikely(notm(tm)))
        luaG_typeerror(L, t, "index");
    }
    /* try the metamethod */
    if (ttisfunction(tm)) {
      luaT_callTM(L, tm, t, key, val);
      return;
    }
    t = tm;  /* else repeat assignment over 'tm' */
    if (luaV_fastget(L, t, key, slot, luaH_get)) {
      luaV_finishfastset(L, t, slot, val);
      return;  /* done */
    }
    /* else 'return luaV_finishset(L, t, key, val, slot)' (loop) */
  }
  luaG_runerror(L, "'__newindex' chain too long; possible loop");
}